

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O2

LispPTR n_new_cursorin(DLword *baseaddr,int dx,int dy,int w,int h)

{
  LispPTR LVar1;
  
  LVar1 = 0;
  if ((((DisplayRegion68k <= baseaddr) && (baseaddr <= DISP_MAX_Address)) &&
      (dx < (int)(*EmMouseX68K + 0x32))) &&
     ((((int)(*EmMouseX68K - 0x32) < w + dx && (dy < (int)(*EmMouseY68K + 0x32))) &&
      ((int)(*EmMouseY68K - 0x32) < h + dy)))) {
    LVar1 = 1;
  }
  return LVar1;
}

Assistant:

LispPTR n_new_cursorin(DLword *baseaddr, int dx, int dy, int w, int h) {
  extern DLword *DisplayRegion68k;

#ifdef INIT
  init_kbd_startup; /* MUST START KBD FOR INIT BEFORE FIRST BITBLT */
#endif

  if (in_display_segment(baseaddr)) {
    if ((dx < MOUSEXR) && (dx + w > MOUSEXL) && (dy < MOUSEYH) && (dy + h > MOUSEYL))
      return (T);
    else
      return (NIL);
  } else
    return (NIL);
}